

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O3

void __thiscall
llvm::SmallVectorTemplateBase<std::pair<void_*,_unsigned_long>,_false>::grow
          (SmallVectorTemplateBase<std::pair<void_*,_unsigned_long>,_false> *this,size_t MinSize)

{
  undefined8 *puVar1;
  SmallVectorTemplateBase<std::pair<void_*,_unsigned_long>,_false> *__ptr;
  undefined8 uVar2;
  uint uVar3;
  ulong uVar4;
  void *pvVar5;
  ulong uVar6;
  long lVar7;
  SmallVectorBase *this_00;
  
  if (MinSize >> 0x20 != 0) {
    report_bad_alloc_error("SmallVector capacity overflow during allocation",true);
  }
  uVar4 = (ulong)(this->super_SmallVectorTemplateCommon<std::pair<void_*,_unsigned_long>,_void>).
                 super_SmallVectorBase.Capacity + 2;
  uVar6 = uVar4 >> 1 | uVar4;
  uVar6 = uVar6 >> 2 | uVar6;
  uVar6 = uVar6 >> 4 | uVar6;
  uVar6 = uVar6 >> 8 | uVar6;
  uVar4 = (uVar4 >> 0x20 | uVar6 >> 0x10 | uVar6) + 1;
  if (uVar4 <= MinSize) {
    uVar4 = MinSize;
  }
  if (0xfffffffe < uVar4) {
    uVar4 = 0xffffffff;
  }
  this_00 = (SmallVectorBase *)(uVar4 << 4);
  pvVar5 = malloc((size_t)this_00);
  if (pvVar5 != (void *)0x0) {
    __ptr = (SmallVectorTemplateBase<std::pair<void_*,_unsigned_long>,_false> *)
            (this->super_SmallVectorTemplateCommon<std::pair<void_*,_unsigned_long>,_void>).
            super_SmallVectorBase.BeginX;
    uVar6 = (ulong)(this->super_SmallVectorTemplateCommon<std::pair<void_*,_unsigned_long>,_void>).
                   super_SmallVectorBase.Size;
    if (uVar6 != 0) {
      lVar7 = 0;
      do {
        puVar1 = (undefined8 *)
                 ((long)&(__ptr->
                         super_SmallVectorTemplateCommon<std::pair<void_*,_unsigned_long>,_void>).
                         super_SmallVectorBase.BeginX + lVar7);
        uVar2 = puVar1[1];
        *(undefined8 *)((long)pvVar5 + lVar7) = *puVar1;
        ((undefined8 *)((long)pvVar5 + lVar7))[1] = uVar2;
        lVar7 = lVar7 + 0x10;
      } while (uVar6 << 4 != lVar7);
    }
    if (__ptr != this + 1) {
      free(__ptr);
    }
    (this->super_SmallVectorTemplateCommon<std::pair<void_*,_unsigned_long>,_void>).
    super_SmallVectorBase.BeginX = pvVar5;
    (this->super_SmallVectorTemplateCommon<std::pair<void_*,_unsigned_long>,_void>).
    super_SmallVectorBase.Capacity = (uint)uVar4;
    return;
  }
  SmallVectorTemplateBase<std::pair<void*,unsigned_long>,false>::grow();
  uVar3 = this_00->Size;
  if (this_00->Capacity <= uVar3) {
    SmallVectorBase::grow_pod(this_00,this_00 + 1,0,8);
    uVar3 = this_00->Size;
  }
  *(undefined8 *)((long)this_00->BeginX + (ulong)uVar3 * 8) = *(undefined8 *)MinSize;
  if (this_00->Size < this_00->Capacity) {
    this_00->Size = this_00->Size + 1;
    return;
  }
  __assert_fail("N <= capacity()",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/include/llvm/ADT/SmallVector.h"
                ,0x43,"void llvm::SmallVectorBase::set_size(size_t)");
}

Assistant:

void SmallVectorTemplateBase<T, TriviallyCopyable>::grow(size_t MinSize) {
  if (MinSize > UINT32_MAX)
    report_bad_alloc_error("SmallVector capacity overflow during allocation");

  // Always grow, even from zero.
  size_t NewCapacity = size_t(NextPowerOf2(this->capacity() + 2));
  NewCapacity = std::min(std::max(NewCapacity, MinSize), size_t(UINT32_MAX));
  T *NewElts = static_cast<T*>(llvm::safe_malloc(NewCapacity*sizeof(T)));

  // Move the elements over.
  this->uninitialized_move(this->begin(), this->end(), NewElts);

  // Destroy the original elements.
  destroy_range(this->begin(), this->end());

  // If this wasn't grown from the inline copy, deallocate the old space.
  if (!this->isSmall())
    free(this->begin());

  this->BeginX = NewElts;
  this->Capacity = NewCapacity;
}